

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::setAllX(SVInt *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t uVar3;
  ulong __n;
  uint64_t *puVar4;
  uint local_18;
  uint32_t i;
  uint32_t words;
  SVInt *this_local;
  
  uVar3 = getNumWords((this->super_SVIntStorage).bitWidth,false);
  local_18 = uVar3;
  if (((this->super_SVIntStorage).unknownFlag & 1U) == 0) {
    bVar2 = isSingleWord(this);
    if ((!bVar2) && (puVar4 = (this->super_SVIntStorage).field_0.pVal, puVar4 != (uint64_t *)0x0)) {
      operator_delete__(puVar4);
    }
    (this->super_SVIntStorage).unknownFlag = true;
    auVar1 = ZEXT416(uVar3 << 1) * ZEXT816(8);
    __n = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      __n = 0xffffffffffffffff;
    }
    puVar4 = (uint64_t *)operator_new__(__n);
    memset(puVar4,0,__n);
    (this->super_SVIntStorage).field_0.pVal = puVar4;
  }
  else {
    memset((this->super_SVIntStorage).field_0.pVal,0,(ulong)(uVar3 << 3));
  }
  for (; local_18 < uVar3 << 1; local_18 = local_18 + 1) {
    (this->super_SVIntStorage).field_0.pVal[local_18] = 0xffffffffffffffff;
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllX() {
    // first set low half to zero (for X)
    uint32_t words = getNumWords(bitWidth, false);
    if (unknownFlag)
        memset(pVal, 0, words * WORD_SIZE);
    else {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[words * 2]();
    }

    // now set upper half to ones (for unknown)
    for (uint32_t i = words; i < words * 2; i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}